

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ExplicitAnsiPortSyntax::setChild
          (ExplicitAnsiPortSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00480788 + *(int *)(&DAT_00480788 + index * 4)))();
  return;
}

Assistant:

void ExplicitAnsiPortSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: direction = child.token(); return;
        case 2: dot = child.token(); return;
        case 3: name = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}